

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_tu(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,uint32_t cMax,
                 uint32_t *val)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  bool bVar7;
  uint32_t tmp;
  uint32_t tmp_1;
  uint32_t local_54;
  uint32_t *local_50;
  uint local_44;
  h264_cabac_context *local_40;
  int *local_38;
  
  local_40 = cabac;
  local_38 = ctxIdx;
  if (str->dir == VS_ENCODE) {
    if (cMax < *val) {
      h264_cabac_tu_cold_1();
LAB_0010815a:
      iVar3 = 1;
    }
    else if (cMax == 0) {
      iVar3 = 0;
    }
    else {
      uVar2 = *val;
      local_50 = (uint32_t *)CONCAT44(local_50._4_4_,numidx + -1);
      iVar3 = 0;
      uVar6 = 0;
      do {
        local_44 = (uint)(uVar6 < uVar2);
        uVar2 = (uint)local_50;
        if ((int)uVar6 < numidx) {
          uVar2 = uVar6;
        }
        iVar1 = h264_cabac_decision(str,local_40,local_38[(int)uVar2],&local_44);
        if (iVar1 != 0) goto LAB_0010815a;
      } while ((uVar6 + 1 < cMax) && (uVar2 = *val, bVar7 = uVar6 < uVar2, uVar6 = uVar6 + 1, bVar7)
              );
    }
  }
  else {
    local_54 = 1;
    iVar3 = 0;
    uVar5 = 0;
    if (cMax != 0) {
      uVar4 = 0;
      local_50 = val;
      do {
        uVar5 = numidx - 1;
        if ((int)uVar4 < numidx) {
          uVar5 = uVar4;
        }
        iVar1 = h264_cabac_decision(str,local_40,local_38[(int)uVar5],&local_54);
        if (iVar1 != 0) goto LAB_0010815a;
        val = local_50;
        uVar5 = uVar4;
      } while ((local_54 != 0) && (uVar4 = uVar4 + 1, uVar5 = cMax, cMax != uVar4));
    }
    *val = uVar5;
  }
  return iVar3;
}

Assistant:

int h264_cabac_tu(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, uint32_t cMax, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i;
		if (*val > cMax) {
			fprintf(stderr, "TU value over limit\n");
			return 1;
		}
		for (i = 0; i <= *val && i < cMax; i++) {
			uint32_t tmp = i < *val;
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
		}
		return 0;
	} else {
		int i;
		uint32_t tmp = 1;
		for (i = 0; i < cMax; i++) {
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
			if (!tmp)
				break;
		}
		*val = i;
		return 0;		
	}
}